

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::BatchedMatMulLayerParams::MergeFrom
          (BatchedMatMulLayerParams *this,BatchedMatMulLayerParams *from)

{
  void *pvVar1;
  LogMessage *other;
  WeightParams *pWVar2;
  WeightParams *pWVar3;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/NeuralNetwork.pb.cc"
               ,0xbd83);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  pWVar3 = from->weights_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (BatchedMatMulLayerParams *)&_BatchedMatMulLayerParams_default_instance_) {
    pWVar2 = this->weights_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->weights_ = pWVar2;
      pWVar3 = from->weights_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  pWVar3 = from->bias_;
  if (pWVar3 != (WeightParams *)0x0 &&
      from != (BatchedMatMulLayerParams *)&_BatchedMatMulLayerParams_default_instance_) {
    pWVar2 = this->bias_;
    if (pWVar2 == (WeightParams *)0x0) {
      pWVar2 = (WeightParams *)operator_new(0x50);
      WeightParams::WeightParams(pWVar2);
      this->bias_ = pWVar2;
      pWVar3 = from->bias_;
    }
    if (pWVar3 == (WeightParams *)0x0) {
      pWVar3 = (WeightParams *)&_WeightParams_default_instance_;
    }
    WeightParams::MergeFrom(pWVar2,pWVar3);
  }
  if (from->weightmatrixfirstdimension_ != 0) {
    this->weightmatrixfirstdimension_ = from->weightmatrixfirstdimension_;
  }
  if (from->weightmatrixseconddimension_ != 0) {
    this->weightmatrixseconddimension_ = from->weightmatrixseconddimension_;
  }
  if (from->transposea_ == true) {
    this->transposea_ = true;
  }
  if (from->transposeb_ == true) {
    this->transposeb_ = true;
  }
  if (from->hasbias_ == true) {
    this->hasbias_ = true;
  }
  if (from->int8dynamicquantize_ == true) {
    this->int8dynamicquantize_ = true;
  }
  return;
}

Assistant:

void BatchedMatMulLayerParams::MergeFrom(const BatchedMatMulLayerParams& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.BatchedMatMulLayerParams)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_weights()) {
    mutable_weights()->::CoreML::Specification::WeightParams::MergeFrom(from.weights());
  }
  if (from.has_bias()) {
    mutable_bias()->::CoreML::Specification::WeightParams::MergeFrom(from.bias());
  }
  if (from.weightmatrixfirstdimension() != 0) {
    set_weightmatrixfirstdimension(from.weightmatrixfirstdimension());
  }
  if (from.weightmatrixseconddimension() != 0) {
    set_weightmatrixseconddimension(from.weightmatrixseconddimension());
  }
  if (from.transposea() != 0) {
    set_transposea(from.transposea());
  }
  if (from.transposeb() != 0) {
    set_transposeb(from.transposeb());
  }
  if (from.hasbias() != 0) {
    set_hasbias(from.hasbias());
  }
  if (from.int8dynamicquantize() != 0) {
    set_int8dynamicquantize(from.int8dynamicquantize());
  }
}